

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

idx_t duckdb::DBConfig::ParseMemoryLimit(string *arg)

{
  TryCast *this;
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  InvalidInputException *this_00;
  ParserException *pPVar4;
  byte bVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined1 in_R8B;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined4 *puVar11;
  idx_t iVar12;
  double dVar13;
  string_t input;
  string_t input_00;
  string unit;
  double result;
  string number;
  string local_d8;
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 local_ac;
  string local_a8;
  pointer local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 *local_50;
  uint local_48;
  undefined4 local_40 [4];
  
  if (((*(arg->_M_dataplus)._M_p == '-') ||
      (iVar2 = ::std::__cxx11::string::compare((char *)arg), iVar2 == 0)) ||
     (iVar2 = ::std::__cxx11::string::compare((char *)arg), iVar2 == 0)) {
    return 0xffffffffffffffff;
  }
  pcVar3 = (arg->_M_dataplus)._M_p;
  for (lVar9 = 0; (bVar5 = pcVar3[lVar9], bVar5 - 9 < 5 || (bVar5 == 0x20)); lVar9 = lVar9 + 1) {
  }
  lVar8 = 0;
  do {
    pcVar3 = pcVar3 + 1;
    if ((char)bVar5 < '0') {
      if (1 < (byte)(bVar5 - 0x2d)) {
LAB_004ce740:
        if (lVar8 == 0) {
          pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,
                     "Memory limit must have a number (e.g. SET memory_limit=1GB","");
          ParserException::ParserException(pPVar4,&local_d8);
          __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::substr((ulong)&local_50,(ulong)arg);
        local_b8 = local_48;
        if (local_48 < 0xd) {
          local_ac = 0;
          uStack_b4 = 0;
          uStack_b0 = 0;
          if (local_48 == 0) {
            puVar11 = (undefined4 *)0x0;
          }
          else {
            switchD_00b041bd::default(&uStack_b4,local_50,(ulong)(local_48 & 0xf));
            puVar11 = (undefined4 *)CONCAT44(local_ac,uStack_b0);
          }
        }
        else {
          uStack_b4 = *local_50;
          puVar11 = local_50;
        }
        this = (TryCast *)CONCAT44(uStack_b4,local_b8);
        uVar6 = 0;
        input_00.value.pointer.ptr = (char *)&local_a8;
        input_00.value._0_8_ = puVar11;
        bVar1 = TryCast::Operation<duckdb::string_t,double>
                          (this,input_00,(double *)0x0,(bool)in_R8B);
        if (!bVar1) {
          this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          input.value.pointer.ptr = (char *)uVar6;
          input.value._0_8_ = puVar11;
          CastExceptionText<duckdb::string_t,double>(&local_d8,(duckdb *)this,input);
          InvalidInputException::InvalidInputException(this_00,&local_d8);
          __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        pcVar3 = (arg->_M_dataplus)._M_p;
        for (uVar10 = lVar9 - lVar8; (bVar5 = pcVar3[uVar10], bVar5 - 9 < 5 || (bVar5 == 0x20));
            uVar10 = uVar10 + 1) {
        }
        while ((uVar10 < arg->_M_string_length &&
               ((uVar7 = (ulong)(byte)pcVar3[uVar10], 0x20 < uVar7 ||
                ((0x100003e00U >> (uVar7 & 0x3f) & 1) == 0))))) {
          uVar10 = uVar10 + 1;
        }
        iVar12 = 0xffffffffffffffff;
        if (0.0 <= (double)local_a8._M_dataplus._M_p) {
          local_88 = local_a8._M_dataplus._M_p;
          uStack_80 = 0;
          ::std::__cxx11::string::substr((ulong)&local_a8,(ulong)arg);
          StringUtil::Lower(&local_d8,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
          dVar13 = 1.0;
          if (iVar2 != 0) {
            iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
            if (iVar2 == 0) {
              dVar13 = 1.0;
            }
            else {
              iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
              dVar13 = 1.0;
              if (iVar2 != 0) {
                iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                dVar13 = 1000.0;
                if (iVar2 != 0) {
                  iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                  if ((iVar2 == 0) ||
                     (iVar2 = ::std::__cxx11::string::compare((char *)&local_d8), iVar2 == 0)) {
                    dVar13 = 1000.0;
                  }
                  else {
                    iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                    dVar13 = 1000.0;
                    if (iVar2 != 0) {
                      iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                      dVar13 = 1000000.0;
                      if (iVar2 != 0) {
                        iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                        if ((iVar2 == 0) ||
                           (iVar2 = ::std::__cxx11::string::compare((char *)&local_d8), iVar2 == 0))
                        {
                          dVar13 = 1000000.0;
                        }
                        else {
                          iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                          dVar13 = 1000000.0;
                          if (iVar2 != 0) {
                            iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                            dVar13 = 1000000000.0;
                            if (iVar2 != 0) {
                              iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                              if ((iVar2 == 0) ||
                                 (iVar2 = ::std::__cxx11::string::compare((char *)&local_d8),
                                 iVar2 == 0)) {
                                dVar13 = 1000000000.0;
                              }
                              else {
                                iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                                dVar13 = 1000000000.0;
                                if (iVar2 != 0) {
                                  iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                                  if (((iVar2 == 0) ||
                                      (iVar2 = ::std::__cxx11::string::compare((char *)&local_d8),
                                      iVar2 == 0)) ||
                                     (iVar2 = ::std::__cxx11::string::compare((char *)&local_d8),
                                     iVar2 == 0)) {
                                    dVar13 = 1000000000000.0;
                                  }
                                  else {
                                    iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                                    dVar13 = 1000000000000.0;
                                    if (iVar2 != 0) {
                                      iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                                      if (iVar2 == 0) {
                                        dVar13 = 1024.0;
                                      }
                                      else {
                                        iVar2 = ::std::__cxx11::string::compare((char *)&local_d8);
                                        if (iVar2 == 0) {
                                          dVar13 = 1048576.0;
                                        }
                                        else {
                                          iVar2 = ::std::__cxx11::string::compare((char *)&local_d8)
                                          ;
                                          if (iVar2 == 0) {
                                            dVar13 = 1073741824.0;
                                          }
                                          else {
                                            iVar2 = ::std::__cxx11::string::compare
                                                              ((char *)&local_d8);
                                            if (iVar2 != 0) {
                                              pPVar4 = (ParserException *)
                                                       __cxa_allocate_exception(0x10);
                                              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2
                                              ;
                                              ::std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_a8,
                                                                                                                  
                                                  "Unknown unit for memory_limit: \'%s\' (expected: KB, MB, GB, TB for 1000^i units or KiB, MiB, GiB, TiB for 1024^i units)"
                                                  ,"");
                                              local_70._M_dataplus._M_p = (pointer)&local_70.field_2
                                              ;
                                              ::std::__cxx11::string::_M_construct<char*>
                                                        ((string *)&local_70,
                                                         local_d8._M_dataplus._M_p,
                                                         local_d8._M_dataplus._M_p +
                                                         local_d8._M_string_length);
                                              ParserException::ParserException<std::__cxx11::string>
                                                        (pPVar4,&local_a8,&local_70);
                                              __cxa_throw(pPVar4,&ParserException::typeinfo,
                                                          ::std::runtime_error::~runtime_error);
                                            }
                                            dVar13 = 1099511627776.0;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          dVar13 = (double)local_88 * dVar13;
          uVar10 = (ulong)dVar13;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          iVar12 = uVar10 | (long)(dVar13 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f;
        }
        if (local_50 == local_40) {
          return iVar12;
        }
        operator_delete(local_50);
        return iVar12;
      }
    }
    else if ((0x39 < bVar5) && ((bVar5 | 0x20) != 0x65)) goto LAB_004ce740;
    bVar5 = pcVar3[lVar9];
    lVar8 = lVar8 + -1;
  } while( true );
}

Assistant:

vector<std::string> DBConfig::GetOptionNames() {
	vector<string> names;
	for (idx_t i = 0, option_count = DBConfig::GetOptionCount(); i < option_count; i++) {
		names.emplace_back(DBConfig::GetOptionByIndex(i)->name);
	}
	return names;
}